

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePathCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_98ff53::HandleConvertCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string_view sVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  ulong uVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  const_reference pvVar6;
  const_reference pvVar7;
  cmMakefile *this_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> _Var8;
  string_view local_388;
  char *local_378;
  size_t local_370;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_368;
  string_view local_358;
  string_view local_348;
  undefined1 local_330 [8];
  string value;
  string local_2f0;
  char *local_2d0;
  size_t local_2c8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_2c0;
  cmCMakePath local_2b0;
  char *local_288;
  size_t sStack_280;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  undefined1 local_248 [8];
  cmCMakePath p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f0;
  char *local_1d8;
  size_t local_1d0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_1c8;
  undefined1 local_1b8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paths;
  string local_198;
  byte local_172;
  allocator<char> local_171;
  undefined1 local_170 [6];
  NormalizeOption arguments;
  cmAlphaNum local_150;
  cmAlphaNum local_120;
  string local_f0;
  size_t local_d0;
  size_t local_c8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_c0;
  char *local_b0;
  size_t local_a8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_a0;
  const_reference local_90;
  value_type *action;
  allocator<char> local_71;
  string local_70;
  undefined1 local_50 [8];
  static_string_view nativePath;
  static_string_view cmakePath;
  static_string_view pathSep;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  join_0x00000010_0x00000000_ = (string_view)::cm::operator____s(":",1);
  join_0x00000010_0x00000000_ = (string_view)::cm::operator____s("TO_CMAKE_PATH_LIST",0x12);
  _local_50 = (string_view)::cm::operator____s("TO_NATIVE_PATH_LIST",0x13);
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if ((sVar4 < 4) ||
     (sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(args), 5 < sVar4)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"CONVERT must be called with three or four arguments.",&local_71)
    ;
    cmExecutionStatus::SetError(status,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
    args_local._7_1_ = false;
  }
  else {
    local_90 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,2);
    local_a0 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_90);
    local_b0 = nativePath.super_string_view._M_str;
    local_a8 = cmakePath.super_string_view._M_len;
    bVar2 = std::operator!=(local_a0,stack0xffffffffffffffc0);
    if (bVar2) {
      local_c0 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_90);
      local_d0 = (size_t)local_50;
      local_c8 = nativePath.super_string_view._M_len;
      bVar2 = std::operator!=(local_c0,_local_50);
      if (bVar2) {
        cmAlphaNum::cmAlphaNum(&local_120,"CONVERT called with an unknown action: ");
        cmAlphaNum::cmAlphaNum(&local_150,local_90);
        cmStrCat<char[2]>(&local_f0,&local_120,&local_150,(char (*) [2])0xd2906b);
        cmExecutionStatus::SetError(status,&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        return false;
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](args,3);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      if ((anonymous_namespace)::
          HandleConvertCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
          ::parser == '\0') {
        iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                     HandleConvertCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                     ::parser);
        if (iVar3 != 0) {
          NormalizeParser::NormalizeParser(&HandleConvertCommand::parser);
          __cxa_atexit(NormalizeParser::~NormalizeParser,&HandleConvertCommand::parser,&__dso_handle
                      );
          __cxa_guard_release(&(anonymous_namespace)::
                               HandleConvertCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                               ::parser);
        }
      }
      local_172 = (byte)CMakePathArgumentParser<(anonymous_namespace)::NormalizeOption>::Parse<4>
                                  (&HandleConvertCommand::parser.
                                    super_CMakePathArgumentParser<(anonymous_namespace)::NormalizeOption>
                                   ,args);
      this = (anonymous_namespace)::CMakePathArgumentParser<(anonymous_namespace)::NormalizeOption>
             ::GetInputs_abi_cxx11_
                       ((CMakePathArgumentParser<(anonymous_namespace)::NormalizeOption> *)
                        &HandleConvertCommand::parser);
      bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(this);
      if (bVar2) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1b8);
        local_1c8 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_90);
        local_1d8 = nativePath.super_string_view._M_str;
        local_1d0 = cmakePath.super_string_view._M_len;
        bVar2 = std::operator==(local_1c8,stack0xffffffffffffffc0);
        if (bVar2) {
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](args,1);
          pvVar6 = std::basic_string_view<char,_std::char_traits<char>_>::front
                             ((basic_string_view<char,_std::char_traits<char>_> *)
                              &cmakePath.super_string_view._M_str);
          cmsys::SystemTools::SplitString(&local_1f0,pvVar7,*pvVar6,false);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_1b8,&local_1f0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_1f0);
        }
        else {
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](args,1);
          sVar1 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar7);
          cmExpandList(sVar1,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_1b8,false);
        }
        __end1 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_1b8);
        path = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_1b8);
        while( true ) {
          bVar2 = __gnu_cxx::operator!=
                            (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)&path);
          if (!bVar2) break;
          p.Path._M_cmpts._M_impl._M_t.
          super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          ._M_t.
          super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl
               = (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                  )__gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end1);
          std::__cxx11::string::string
                    ((string *)&local_268,
                     (string *)
                     p.Path._M_cmpts._M_impl._M_t.
                     super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                     .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                     _M_head_impl);
          _Var8 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_90);
          local_288 = nativePath.super_string_view._M_str;
          sStack_280 = cmakePath.super_string_view._M_len;
          local_278 = _Var8;
          bVar2 = std::operator==(_Var8,stack0xffffffffffffffc0);
          cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
                    ((cmCMakePath *)local_248,&local_268,!bVar2);
          std::__cxx11::string::~string((string *)&local_268);
          if ((local_172 & 1) != 0) {
            cmCMakePath::Normal(&local_2b0,(cmCMakePath *)local_248);
            cmCMakePath::operator=((cmCMakePath *)local_248,&local_2b0);
            cmCMakePath::~cmCMakePath(&local_2b0);
          }
          _Var8 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_90);
          local_2d0 = nativePath.super_string_view._M_str;
          local_2c8 = cmakePath.super_string_view._M_len;
          local_2c0 = _Var8;
          bVar2 = std::operator==(_Var8,stack0xffffffffffffffc0);
          if (bVar2) {
            cmCMakePath::GenericString_abi_cxx11_(&local_2f0,(cmCMakePath *)local_248);
            std::__cxx11::string::operator=
                      ((string *)
                       p.Path._M_cmpts._M_impl._M_t.
                       super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                       .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                       ._M_head_impl,(string *)&local_2f0);
            std::__cxx11::string::~string((string *)&local_2f0);
          }
          else {
            cmCMakePath::NativeString_abi_cxx11_
                      ((string *)((long)&value.field_2 + 8),(cmCMakePath *)local_248);
            std::__cxx11::string::operator=
                      ((string *)
                       p.Path._M_cmpts._M_impl._M_t.
                       super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                       .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                       ._M_head_impl,(string *)(value.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
          }
          cmCMakePath::~cmCMakePath((cmCMakePath *)local_248);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end1);
        }
        local_368 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_90);
        local_378 = nativePath.super_string_view._M_str;
        local_370 = cmakePath.super_string_view._M_len;
        bVar2 = std::operator==(local_368,stack0xffffffffffffffc0);
        local_358 = stack0xffffffffffffffd0;
        if (bVar2) {
          local_358 = (string_view)::cm::operator____s(";",1);
        }
        local_348 = local_358;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_388);
        cmJoin((string *)local_330,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1b8,local_348,local_388);
        this_00 = cmExecutionStatus::GetMakefile(status);
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](args,3);
        sVar1 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_330);
        cmMakefile::AddDefinition(this_00,pvVar7,sVar1);
        args_local._7_1_ = true;
        std::__cxx11::string::~string((string *)local_330);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1b8);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_198,"CONVERT called with unexpected arguments.",
                   (allocator<char> *)
                   ((long)&paths.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        cmExecutionStatus::SetError(status,&local_198);
        std::__cxx11::string::~string((string *)&local_198);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&paths.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        args_local._7_1_ = false;
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_170,"Invalid name for output variable.",&local_171);
      cmExecutionStatus::SetError(status,(string *)local_170);
      std::__cxx11::string::~string((string *)local_170);
      std::allocator<char>::~allocator(&local_171);
      args_local._7_1_ = false;
    }
  }
  return args_local._7_1_;
}

Assistant:

bool HandleConvertCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
  const auto pathSep = ";"_s;
#else
  const auto pathSep = ":"_s;
#endif
  const auto cmakePath = "TO_CMAKE_PATH_LIST"_s;
  const auto nativePath = "TO_NATIVE_PATH_LIST"_s;

  if (args.size() < 4 || args.size() > 5) {
    status.SetError("CONVERT must be called with three or four arguments.");
    return false;
  }

  const auto& action = args[2];

  if (action != cmakePath && action != nativePath) {
    status.SetError(
      cmStrCat("CONVERT called with an unknown action: ", action, "."));
    return false;
  }

  if (args[3].empty()) {
    status.SetError("Invalid name for output variable.");
    return false;
  }

  static NormalizeParser const parser;

  const auto arguments = parser.Parse<4>(args);

  if (!parser.GetInputs().empty()) {
    status.SetError("CONVERT called with unexpected arguments.");
    return false;
  }

  std::vector<std::string> paths;

  if (action == cmakePath) {
    paths = cmSystemTools::SplitString(args[1], pathSep.front());
  } else {
    cmExpandList(args[1], paths);
  }

  for (auto& path : paths) {
    auto p = cmCMakePath(path,
                         action == cmakePath ? cmCMakePath::native_format
                                             : cmCMakePath::generic_format);
    if (arguments.Normalize) {
      p = p.Normal();
    }
    if (action == cmakePath) {
      path = p.GenericString();
    } else {
      path = p.NativeString();
    }
  }

  auto value = cmJoin(paths, action == cmakePath ? ";"_s : pathSep);
  status.GetMakefile().AddDefinition(args[3], value);

  return true;
}